

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O3

TermList __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Applicator::
apply(Applicator *this,uint var)

{
  bool bVar1;
  Entry *pEVar2;
  TermList TVar3;
  TermList *cacheEntry;
  TermList *local_20;
  uint local_14;
  
  bVar1 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
          getValuePtr(&this->_cache,var,&local_20);
  if (bVar1) {
    local_14 = var;
    pEVar2 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::findEntry
                       (&this->_resultNormalizer->_data,&local_14);
    TVar3._content =
         (this->_parent->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array
         [pEVar2->_val]._obj._content;
    local_20->_content = TVar3._content;
  }
  else {
    TVar3._content = local_20->_content;
  }
  return (TermList)TVar3._content;
}

Assistant:

TermList apply(unsigned var)
  {
    TermList* cacheEntry;
    if(_cache.getValuePtr(var,cacheEntry)) {
      ASS(_resultNormalizer->contains(var));
      unsigned nvar=_resultNormalizer->get(var);
      ASS(_parent->_bindings.find(nvar));
      *cacheEntry=_parent->_bindings.get(nvar);
    }
    return *cacheEntry;
  }